

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastMdS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  bool bVar1;
  uint uVar2;
  TcParseTableBase *pTVar3;
  MessageLite *pMVar4;
  ulong uVar5;
  char *pcVar6;
  Nonnull<const_char_*> failure_msg;
  Arena *arena;
  uint *puVar7;
  long *plVar8;
  TcParseTableBase *unaff_R13;
  ushort *puVar9;
  pair<const_char_*,_int> pVar10;
  MessageLite *unaff_retaddr;
  ushort *local_48;
  char *local_38;
  
  if (data.field_0._0_2_ != 0) {
    pcVar6 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar6;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar7 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar7 & 3) != 0) {
      AlignFail();
    }
    *puVar7 = *puVar7 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  plVar8 = (long *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)plVar8 & 7) != 0) {
    AlignFail(plVar8);
  }
  pTVar3 = MessageLite::GetTcParseTable
                     (*(MessageLite **)
                       ((long)&table->has_bits_offset +
                       ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset));
  if (*plVar8 == 0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar4 = ClassData::New(pTVar3->class_data,arena);
    *plVar8 = (long)pMVar4;
  }
  if (ptr[2] < '\0') {
    pVar10 = ReadSizeFallback(ptr + 2,(uint)(byte)ptr[2]);
    puVar9 = (ushort *)pVar10.first;
  }
  else {
    puVar9 = (ushort *)(ptr + 3);
  }
  if ((puVar9 == (ushort *)0x0) || (ctx->depth_ < 1)) {
    puVar9 = (ushort *)0x0;
  }
  else {
    EpsCopyInputStream::PushLimit
              ((EpsCopyInputStream *)&stack0xffffffffffffffb8,(char *)ctx,(int)puVar9);
    msg = (MessageLite *)((ulong)local_48 & 0xffffffff);
    ctx->depth_ = ctx->depth_ + -1;
  }
  if (puVar9 != (ushort *)0x0) {
    local_38 = (char *)(long)ctx->depth_;
    pMVar4 = (MessageLite *)*plVar8;
    local_48 = puVar9;
    while (bVar1 = EpsCopyInputStream::DoneWithCheck<false>
                             (&ctx->super_EpsCopyInputStream,(char **)&stack0xffffffffffffffb8,
                              ctx->group_depth_), !bVar1) {
      uVar2 = (uint)pTVar3->fast_idx_mask & (uint)*local_48;
      if ((uVar2 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar5 = (ulong)(uVar2 & 0xfffffff8);
      local_48 = (ushort *)
                 (**(code **)(&pTVar3[1].has_bits_offset + uVar5))
                           (pMVar4,local_48,ctx,
                            (ulong)*local_48 ^ *(ulong *)(&pTVar3[1].fast_idx_mask + uVar5 * 2),
                            pTVar3,0);
      if ((local_48 == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
      break;
    }
    if ((pTVar3->field_0x9 & 1) == 0) {
      puVar9 = local_48;
      if (local_48 == (ushort *)0x0) {
        VerifyHasBitConsistency(unaff_retaddr,unaff_R13);
        puVar9 = local_48;
      }
    }
    else {
      puVar9 = (ushort *)(*pTVar3->post_loop_handler)(pMVar4,(char *)local_48,ctx);
    }
    if (puVar9 != (ushort *)0x0) {
      if ((int)local_38 == ctx->depth_) {
        failure_msg = (Nonnull<const_char_*>)0x0;
      }
      else {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                ((long)local_38,(long)ctx->depth_,"old_depth == depth_");
      }
      if (failure_msg != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&stack0xffffffffffffffb8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,0x481,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&stack0xffffffffffffffb8);
      }
    }
    ctx->depth_ = ctx->depth_ + 1;
    uVar2 = (int)msg + (ctx->super_EpsCopyInputStream).limit_;
    (ctx->super_EpsCopyInputStream).limit_ = uVar2;
    if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ == 0) {
      (ctx->super_EpsCopyInputStream).limit_end_ =
           (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar2 >> 0x1f & uVar2);
      return (char *)puVar9;
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMdS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint16_t, false, false>(
      PROTOBUF_TC_PARAM_PASS);
}